

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O1

int __thiscall jpgd::jpeg_decoder::decode(jpeg_decoder *this,void **pScan_line,uint *pScan_line_len)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  uint32_t uVar5;
  long lVar6;
  uint8 *puVar7;
  
  if (this->m_error_code != JPGD_SUCCESS) {
    return -1;
  }
  if (this->m_ready_flag != true) {
    return -1;
  }
  iVar4 = this->m_total_lines_left;
  if (iVar4 == 0) {
    return 1;
  }
  if ((this->m_flags & 1) == 0) {
    bVar1 = false;
  }
  else {
    bVar1 = false;
    if ((this->m_scan_type - 3U < 2) && (1 < this->m_image_x_size)) {
      bVar1 = 1 < this->m_image_y_size;
    }
  }
  if (bVar1) {
    if (iVar4 == this->m_image_y_size) {
      bVar3 = true;
      goto LAB_001da8bd;
    }
    bVar3 = 1 < iVar4 && this->m_mcu_lines_left == 1;
    bVar2 = bVar3;
  }
  else {
    bVar3 = this->m_mcu_lines_left == 0;
LAB_001da8bd:
    bVar2 = false;
  }
  if ((bVar3) && (iVar4 = decode_next_mcu_row(this), iVar4 != 0)) {
    return iVar4;
  }
  switch(this->m_scan_type) {
  case 0:
    gray_convert(this);
    break;
  case 1:
    H1V1Convert(this);
    break;
  case 2:
    if ((((this->m_flags & 1) == 0) || (this->m_image_x_size < 2)) || (this->m_image_y_size < 2)) {
      H2V1Convert(this);
    }
    else {
      H2V1ConvertFiltered(this);
    }
    break;
  case 3:
    if (bVar1) {
      H1V2ConvertFiltered(this);
      break;
    }
    if ((this->m_mcu_lines_left & 1) == 0) {
      H1V2Convert(this);
      break;
    }
LAB_001da9fb:
    puVar7 = this->m_pScan_line_1;
    goto LAB_001da9d3;
  case 4:
    if ((((this->m_flags & 1) != 0) && (1 < this->m_image_x_size)) && (1 < this->m_image_y_size)) {
      if (this->m_num_buffered_scanlines == 1) {
        lVar6 = 0x34c0;
LAB_001daa09:
        *pScan_line = *(void **)((long)this->m_jmp_state[0].__jmpbuf + lVar6);
      }
      else if (this->m_num_buffered_scanlines == 0) {
        uVar5 = H2V2ConvertFiltered(this);
        this->m_num_buffered_scanlines = uVar5;
        lVar6 = 0x34b8;
        goto LAB_001daa09;
      }
      this->m_num_buffered_scanlines = this->m_num_buffered_scanlines + -1;
      goto switchD_001da907_default;
    }
    if ((this->m_mcu_lines_left & 1) != 0) goto LAB_001da9fb;
    H2V2Convert(this);
    break;
  default:
    goto switchD_001da907_default;
  }
  puVar7 = this->m_pScan_line_0;
LAB_001da9d3:
  *pScan_line = puVar7;
switchD_001da907_default:
  *pScan_line_len = this->m_real_dest_bytes_per_scan_line;
  if (!bVar2) {
    this->m_mcu_lines_left = this->m_mcu_lines_left + -1;
  }
  this->m_total_lines_left = this->m_total_lines_left + -1;
  return 0;
}

Assistant:

int jpeg_decoder::decode(const void** pScan_line, uint* pScan_line_len)
	{
		if ((m_error_code) || (!m_ready_flag))
			return JPGD_FAILED;

		if (m_total_lines_left == 0)
			return JPGD_DONE;

		const bool chroma_y_filtering = (m_flags & cFlagLinearChromaFiltering) && ((m_scan_type == JPGD_YH2V2) || (m_scan_type == JPGD_YH1V2)) && (m_image_x_size >= 2) && (m_image_y_size >= 2);

		bool get_another_mcu_row = false;
		bool got_mcu_early = false;
		if (chroma_y_filtering)
		{
			if (m_total_lines_left == m_image_y_size)
				get_another_mcu_row = true;
			else if ((m_mcu_lines_left == 1) && (m_total_lines_left > 1))
			{
				get_another_mcu_row = true;
				got_mcu_early = true;
			}
		}
		else
		{
			get_another_mcu_row = (m_mcu_lines_left == 0);
		}

		if (get_another_mcu_row)
		{
			int status = decode_next_mcu_row();
			if (status != 0)
				return status;
		}

		switch (m_scan_type)
		{
		case JPGD_YH2V2:
		{
			if ((m_flags & cFlagLinearChromaFiltering) && (m_image_x_size >= 2) && (m_image_y_size >= 2))
			{
				if (m_num_buffered_scanlines == 1)
				{
					*pScan_line = m_pScan_line_1;
				}
				else if (m_num_buffered_scanlines == 0)
				{
					m_num_buffered_scanlines = H2V2ConvertFiltered();
					*pScan_line = m_pScan_line_0;
				}

				m_num_buffered_scanlines--;
			}
			else
			{
				if ((m_mcu_lines_left & 1) == 0)
				{
					H2V2Convert();
					*pScan_line = m_pScan_line_0;
				}
				else
					*pScan_line = m_pScan_line_1;
			}

			break;
		}
		case JPGD_YH2V1:
		{
			if ((m_flags & cFlagLinearChromaFiltering) && (m_image_x_size >= 2) && (m_image_y_size >= 2))
				H2V1ConvertFiltered();
			else
				H2V1Convert();
			*pScan_line = m_pScan_line_0;
			break;
		}
		case JPGD_YH1V2:
		{
			if (chroma_y_filtering)
			{
				H1V2ConvertFiltered();
				*pScan_line = m_pScan_line_0;
			}
			else
			{
				if ((m_mcu_lines_left & 1) == 0)
				{
					H1V2Convert();
					*pScan_line = m_pScan_line_0;
				}
				else
					*pScan_line = m_pScan_line_1;
			}

			break;
		}
		case JPGD_YH1V1:
		{
			H1V1Convert();
			*pScan_line = m_pScan_line_0;
			break;
		}
		case JPGD_GRAYSCALE:
		{
			gray_convert();
			*pScan_line = m_pScan_line_0;

			break;
		}
		}

		*pScan_line_len = m_real_dest_bytes_per_scan_line;

		if (!got_mcu_early)
		{
			m_mcu_lines_left--;
		}

		m_total_lines_left--;

		return JPGD_SUCCESS;
	}